

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  ushort uVar16;
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar26;
  short sVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar37 [16];
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar49;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar69;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  
  auVar1 = *(undefined1 (*) [16])left;
  auVar37 = *(undefined1 (*) [16])above;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar37._0_13_;
  auVar10[0xe] = auVar37[7];
  auVar11[0xc] = auVar37[6];
  auVar11._0_12_ = auVar37._0_12_;
  auVar11._13_2_ = auVar10._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar37._0_11_;
  auVar12._12_3_ = auVar11._12_3_;
  auVar13[10] = auVar37[5];
  auVar13._0_10_ = auVar37._0_10_;
  auVar13._11_4_ = auVar12._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar37._0_9_;
  auVar14._10_5_ = auVar13._10_5_;
  auVar15[8] = auVar37[4];
  auVar15._0_8_ = auVar37._0_8_;
  auVar15._9_6_ = auVar14._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar15._8_7_;
  Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar37[3]);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var18;
  auVar19._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar19[0] = auVar37[2];
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar19;
  auVar20._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar20[0] = auVar37[1];
  auVar25._0_2_ = CONCAT11(0,auVar37[0]);
  auVar25._2_13_ = auVar20;
  auVar25[0xf] = 0;
  auVar24._0_2_ = CONCAT11(0,auVar37[8]);
  auVar24[2] = auVar37[9];
  auVar24[3] = 0;
  auVar24[4] = auVar37[10];
  auVar24[5] = 0;
  auVar24[6] = auVar37[0xb];
  auVar24[7] = 0;
  auVar24[8] = auVar37[0xc];
  auVar24[9] = 0;
  auVar24[10] = auVar37[0xd];
  auVar24[0xb] = 0;
  auVar24[0xc] = auVar37[0xe];
  auVar24[0xd] = 0;
  auVar24[0xe] = auVar37[0xf];
  auVar24[0xf] = 0;
  auVar27 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar28._0_4_ = auVar27._0_4_;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  sVar26 = auVar27._0_2_;
  auVar30._0_2_ = auVar25._0_2_ - sVar26;
  sVar29 = auVar27._2_2_;
  sVar31 = auVar20._0_2_;
  auVar30._2_2_ = sVar31 - sVar29;
  sVar32 = auVar19._0_2_;
  auVar30._4_2_ = sVar32 - sVar26;
  sVar33 = (short)Var18;
  auVar30._6_2_ = sVar33 - sVar29;
  sVar34 = auVar15._8_2_;
  auVar30._8_2_ = sVar34 - sVar26;
  sVar35 = auVar13._10_2_;
  auVar30._10_2_ = sVar35 - sVar29;
  sVar36 = auVar11._12_2_;
  uVar16 = auVar10._13_2_ >> 8;
  auVar30._12_2_ = sVar36 - sVar26;
  auVar30._14_2_ = uVar16 - sVar29;
  auVar27 = pabsw(in_XMM4,auVar30);
  iVar23 = 0x10;
  auVar38._0_2_ = auVar24._0_2_ - sVar26;
  uVar39 = (ushort)auVar37[9];
  auVar38._2_2_ = uVar39 - sVar29;
  uVar40 = (ushort)auVar37[10];
  auVar38._4_2_ = uVar40 - sVar26;
  uVar41 = (ushort)auVar37[0xb];
  auVar38._6_2_ = uVar41 - sVar29;
  uVar42 = (ushort)auVar37[0xc];
  auVar38._8_2_ = uVar42 - sVar26;
  uVar43 = (ushort)auVar37[0xd];
  auVar38._10_2_ = uVar43 - sVar29;
  uVar44 = (ushort)auVar37[0xe];
  uVar45 = (ushort)auVar37[0xf];
  auVar38._12_2_ = uVar44 - sVar26;
  auVar38._14_2_ = uVar45 - sVar29;
  auVar38 = pabsw(auVar38,auVar38);
  auVar37 = _DAT_004e29c0;
  do {
    auVar46 = pshufb(auVar1,auVar37);
    sVar49 = auVar30._0_2_ + auVar46._0_2_;
    sVar52 = auVar30._2_2_ + auVar46._2_2_;
    sVar53 = auVar30._4_2_ + auVar46._4_2_;
    sVar54 = auVar30._6_2_ + auVar46._6_2_;
    sVar55 = auVar30._8_2_ + auVar46._8_2_;
    sVar56 = auVar30._10_2_ + auVar46._10_2_;
    sVar57 = auVar30._12_2_ + auVar46._12_2_;
    sVar58 = auVar30._14_2_ + auVar46._14_2_;
    auVar59._0_2_ = sVar49 - auVar25._0_2_;
    auVar59._2_2_ = sVar52 - sVar31;
    auVar59._4_2_ = sVar53 - sVar32;
    auVar59._6_2_ = sVar54 - sVar33;
    auVar59._8_2_ = sVar55 - sVar34;
    auVar59._10_2_ = sVar56 - sVar35;
    auVar59._12_2_ = sVar57 - sVar36;
    auVar59._14_2_ = sVar58 - uVar16;
    auVar59 = pabsw(auVar59,auVar59);
    auVar63._0_2_ = sVar49 - sVar26;
    auVar63._2_2_ = sVar52 - sVar29;
    auVar63._4_2_ = sVar53 - sVar26;
    auVar63._6_2_ = sVar54 - sVar29;
    auVar63._8_2_ = sVar55 - sVar26;
    auVar63._10_2_ = sVar56 - sVar29;
    auVar63._12_2_ = sVar57 - sVar26;
    auVar63._14_2_ = sVar58 - sVar29;
    auVar63 = pabsw(in_XMM12,auVar63);
    sVar69 = auVar27._0_2_;
    auVar70._0_2_ = -(ushort)(auVar59._0_2_ < sVar69);
    sVar74 = auVar27._2_2_;
    auVar70._2_2_ = -(ushort)(auVar59._2_2_ < sVar74);
    sVar75 = auVar27._4_2_;
    auVar70._4_2_ = -(ushort)(auVar59._4_2_ < sVar75);
    sVar76 = auVar27._6_2_;
    auVar70._6_2_ = -(ushort)(auVar59._6_2_ < sVar76);
    sVar77 = auVar27._8_2_;
    auVar70._8_2_ = -(ushort)(auVar59._8_2_ < sVar77);
    sVar78 = auVar27._10_2_;
    auVar70._10_2_ = -(ushort)(auVar59._10_2_ < sVar78);
    sVar79 = auVar27._12_2_;
    sVar80 = auVar27._14_2_;
    auVar70._12_2_ = -(ushort)(auVar59._12_2_ < sVar79);
    auVar70._14_2_ = -(ushort)(auVar59._14_2_ < sVar80);
    auVar72._0_2_ = -(ushort)(auVar63._0_2_ < sVar69);
    auVar72._2_2_ = -(ushort)(auVar63._2_2_ < sVar74);
    auVar72._4_2_ = -(ushort)(auVar63._4_2_ < sVar75);
    auVar72._6_2_ = -(ushort)(auVar63._6_2_ < sVar76);
    auVar72._8_2_ = -(ushort)(auVar63._8_2_ < sVar77);
    auVar72._10_2_ = -(ushort)(auVar63._10_2_ < sVar78);
    auVar72._12_2_ = -(ushort)(auVar63._12_2_ < sVar79);
    auVar72._14_2_ = -(ushort)(auVar63._14_2_ < sVar80);
    auVar60._0_2_ = -(ushort)(auVar63._0_2_ < auVar59._0_2_);
    auVar60._2_2_ = -(ushort)(auVar63._2_2_ < auVar59._2_2_);
    auVar60._4_2_ = -(ushort)(auVar63._4_2_ < auVar59._4_2_);
    auVar60._6_2_ = -(ushort)(auVar63._6_2_ < auVar59._6_2_);
    auVar60._8_2_ = -(ushort)(auVar63._8_2_ < auVar59._8_2_);
    auVar60._10_2_ = -(ushort)(auVar63._10_2_ < auVar59._10_2_);
    auVar60._12_2_ = -(ushort)(auVar63._12_2_ < auVar59._12_2_);
    auVar60._14_2_ = -(ushort)(auVar63._14_2_ < auVar59._14_2_);
    auVar64._0_2_ = auVar46._0_2_ - sVar26;
    auVar64._2_2_ = auVar46._2_2_ - sVar29;
    auVar64._4_2_ = auVar46._4_2_ - sVar26;
    auVar64._6_2_ = auVar46._6_2_ - sVar29;
    auVar64._8_2_ = auVar46._8_2_ - sVar26;
    auVar64._10_2_ = auVar46._10_2_ - sVar29;
    auVar64._12_2_ = auVar46._12_2_ - sVar26;
    auVar64._14_2_ = auVar46._14_2_ - sVar29;
    auVar59 = pabsw(auVar70,auVar64);
    auVar65._0_2_ = (auVar64._0_2_ + auVar24._0_2_) - sVar26;
    auVar65._2_2_ = (auVar64._2_2_ + uVar39) - sVar29;
    auVar65._4_2_ = (auVar64._4_2_ + uVar40) - sVar26;
    auVar65._6_2_ = (auVar64._6_2_ + uVar41) - sVar29;
    auVar65._8_2_ = (auVar64._8_2_ + uVar42) - sVar26;
    auVar65._10_2_ = (auVar64._10_2_ + uVar43) - sVar29;
    auVar65._12_2_ = (auVar64._12_2_ + uVar44) - sVar26;
    auVar65._14_2_ = (auVar64._14_2_ + uVar45) - sVar29;
    auVar63 = pabsw(auVar65,auVar65);
    auVar81._0_2_ = -(ushort)(auVar59._0_2_ < auVar38._0_2_);
    auVar81._2_2_ = -(ushort)(auVar59._2_2_ < auVar38._2_2_);
    auVar81._4_2_ = -(ushort)(auVar59._4_2_ < auVar38._4_2_);
    auVar81._6_2_ = -(ushort)(auVar59._6_2_ < auVar38._6_2_);
    auVar81._8_2_ = -(ushort)(auVar59._8_2_ < auVar38._8_2_);
    auVar81._10_2_ = -(ushort)(auVar59._10_2_ < auVar38._10_2_);
    auVar81._12_2_ = -(ushort)(auVar59._12_2_ < auVar38._12_2_);
    auVar81._14_2_ = -(ushort)(auVar59._14_2_ < auVar38._14_2_);
    auVar83._0_2_ = -(ushort)(auVar63._0_2_ < auVar38._0_2_);
    auVar83._2_2_ = -(ushort)(auVar63._2_2_ < auVar38._2_2_);
    auVar83._4_2_ = -(ushort)(auVar63._4_2_ < auVar38._4_2_);
    auVar83._6_2_ = -(ushort)(auVar63._6_2_ < auVar38._6_2_);
    auVar83._8_2_ = -(ushort)(auVar63._8_2_ < auVar38._8_2_);
    auVar83._10_2_ = -(ushort)(auVar63._10_2_ < auVar38._10_2_);
    auVar83._12_2_ = -(ushort)(auVar63._12_2_ < auVar38._12_2_);
    auVar83._14_2_ = -(ushort)(auVar63._14_2_ < auVar38._14_2_);
    auVar71._0_2_ = -(ushort)(auVar63._0_2_ < auVar59._0_2_);
    auVar71._2_2_ = -(ushort)(auVar63._2_2_ < auVar59._2_2_);
    auVar71._4_2_ = -(ushort)(auVar63._4_2_ < auVar59._4_2_);
    auVar71._6_2_ = -(ushort)(auVar63._6_2_ < auVar59._6_2_);
    auVar71._8_2_ = -(ushort)(auVar63._8_2_ < auVar59._8_2_);
    auVar71._10_2_ = -(ushort)(auVar63._10_2_ < auVar59._10_2_);
    auVar71._12_2_ = -(ushort)(auVar63._12_2_ < auVar59._12_2_);
    auVar71._14_2_ = -(ushort)(auVar63._14_2_ < auVar59._14_2_);
    in_XMM12 = auVar28 & auVar71;
    auVar59 = (~auVar60 & auVar25 | auVar28 & auVar60) & (auVar72 | auVar70);
    auVar63 = ~(auVar72 | auVar70) & auVar46 | auVar59;
    auVar72 = (~auVar71 & auVar24 | in_XMM12) & (auVar83 | auVar81);
    auVar46 = ~(auVar83 | auVar81) & auVar46 | auVar72;
    sVar49 = auVar63._0_2_;
    sVar52 = auVar63._2_2_;
    sVar53 = auVar63._4_2_;
    sVar54 = auVar63._6_2_;
    sVar55 = auVar63._8_2_;
    sVar56 = auVar63._10_2_;
    sVar57 = auVar63._12_2_;
    sVar58 = auVar63._14_2_;
    sVar2 = auVar46._0_2_;
    sVar3 = auVar46._2_2_;
    sVar4 = auVar46._4_2_;
    sVar5 = auVar46._6_2_;
    sVar6 = auVar46._8_2_;
    sVar7 = auVar46._10_2_;
    sVar8 = auVar46._12_2_;
    sVar9 = auVar46._14_2_;
    *dst = (0 < sVar49) * (sVar49 < 0x100) * auVar63[0] - (0xff < sVar49);
    dst[1] = (0 < sVar52) * (sVar52 < 0x100) * auVar63[2] - (0xff < sVar52);
    dst[2] = (0 < sVar53) * (sVar53 < 0x100) * auVar63[4] - (0xff < sVar53);
    dst[3] = (0 < sVar54) * (sVar54 < 0x100) * auVar63[6] - (0xff < sVar54);
    dst[4] = (0 < sVar55) * (sVar55 < 0x100) * auVar63[8] - (0xff < sVar55);
    dst[5] = (0 < sVar56) * (sVar56 < 0x100) * auVar63[10] - (0xff < sVar56);
    dst[6] = (0 < sVar57) * (sVar57 < 0x100) * auVar63[0xc] - (0xff < sVar57);
    dst[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar63[0xe] - (0xff < sVar58);
    dst[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar46[0] - (0xff < sVar2);
    dst[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar46[2] - (0xff < sVar3);
    dst[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar46[4] - (0xff < sVar4);
    dst[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar46[6] - (0xff < sVar5);
    dst[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar46[8] - (0xff < sVar6);
    dst[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar46[10] - (0xff < sVar7);
    dst[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar46[0xc] - (0xff < sVar8);
    dst[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar46[0xe] - (0xff < sVar9);
    dst = dst + stride;
    auVar46._0_2_ = auVar37._0_2_ + 1;
    auVar46._2_2_ = auVar37._2_2_ + 1;
    auVar46._4_2_ = auVar37._4_2_ + 1;
    auVar46._6_2_ = auVar37._6_2_ + 1;
    auVar46._8_2_ = auVar37._8_2_ + 1;
    auVar46._10_2_ = auVar37._10_2_ + 1;
    auVar46._12_2_ = auVar37._12_2_ + 1;
    auVar46._14_2_ = auVar37._14_2_ + 1;
    iVar23 = iVar23 + -1;
    auVar37 = auVar46;
  } while (iVar23 != 0);
  auVar1 = *(undefined1 (*) [16])(left + 0x10);
  iVar23 = 0x10;
  auVar37 = _DAT_004e29c0;
  do {
    auVar27 = pshufb(auVar1,auVar37);
    sVar49 = auVar30._0_2_ + auVar27._0_2_;
    sVar52 = auVar30._2_2_ + auVar27._2_2_;
    sVar53 = auVar30._4_2_ + auVar27._4_2_;
    sVar54 = auVar30._6_2_ + auVar27._6_2_;
    sVar55 = auVar30._8_2_ + auVar27._8_2_;
    sVar56 = auVar30._10_2_ + auVar27._10_2_;
    sVar57 = auVar30._12_2_ + auVar27._12_2_;
    sVar58 = auVar30._14_2_ + auVar27._14_2_;
    auVar50._0_2_ = sVar49 - auVar25._0_2_;
    auVar50._2_2_ = sVar52 - sVar31;
    auVar50._4_2_ = sVar53 - sVar32;
    auVar50._6_2_ = sVar54 - sVar33;
    auVar50._8_2_ = sVar55 - sVar34;
    auVar50._10_2_ = sVar56 - sVar35;
    auVar50._12_2_ = sVar57 - sVar36;
    auVar50._14_2_ = sVar58 - uVar16;
    auVar38 = pabsw(auVar50,auVar50);
    auVar47._0_2_ = sVar49 - sVar26;
    auVar47._2_2_ = sVar52 - sVar29;
    auVar47._4_2_ = sVar53 - sVar26;
    auVar47._6_2_ = sVar54 - sVar29;
    auVar47._8_2_ = sVar55 - sVar26;
    auVar47._10_2_ = sVar56 - sVar29;
    auVar47._12_2_ = sVar57 - sVar26;
    auVar47._14_2_ = sVar58 - sVar29;
    auVar46 = pabsw(auVar59,auVar47);
    auVar66._0_2_ = -(ushort)(auVar38._0_2_ < sVar69);
    auVar66._2_2_ = -(ushort)(auVar38._2_2_ < sVar74);
    auVar66._4_2_ = -(ushort)(auVar38._4_2_ < sVar75);
    auVar66._6_2_ = -(ushort)(auVar38._6_2_ < sVar76);
    auVar66._8_2_ = -(ushort)(auVar38._8_2_ < sVar77);
    auVar66._10_2_ = -(ushort)(auVar38._10_2_ < sVar78);
    auVar66._12_2_ = -(ushort)(auVar38._12_2_ < sVar79);
    auVar66._14_2_ = -(ushort)(auVar38._14_2_ < sVar80);
    auVar48._0_2_ = -(ushort)(auVar46._0_2_ < sVar69);
    auVar48._2_2_ = -(ushort)(auVar46._2_2_ < sVar74);
    auVar48._4_2_ = -(ushort)(auVar46._4_2_ < sVar75);
    auVar48._6_2_ = -(ushort)(auVar46._6_2_ < sVar76);
    auVar48._8_2_ = -(ushort)(auVar46._8_2_ < sVar77);
    auVar48._10_2_ = -(ushort)(auVar46._10_2_ < sVar78);
    auVar48._12_2_ = -(ushort)(auVar46._12_2_ < sVar79);
    auVar48._14_2_ = -(ushort)(auVar46._14_2_ < sVar80);
    auVar51._0_2_ = -(ushort)(auVar46._0_2_ < auVar38._0_2_);
    auVar51._2_2_ = -(ushort)(auVar46._2_2_ < auVar38._2_2_);
    auVar51._4_2_ = -(ushort)(auVar46._4_2_ < auVar38._4_2_);
    auVar51._6_2_ = -(ushort)(auVar46._6_2_ < auVar38._6_2_);
    auVar51._8_2_ = -(ushort)(auVar46._8_2_ < auVar38._8_2_);
    auVar51._10_2_ = -(ushort)(auVar46._10_2_ < auVar38._10_2_);
    auVar51._12_2_ = -(ushort)(auVar46._12_2_ < auVar38._12_2_);
    auVar51._14_2_ = -(ushort)(auVar46._14_2_ < auVar38._14_2_);
    auVar67._0_2_ = auVar27._0_2_ - sVar26;
    auVar67._2_2_ = auVar27._2_2_ - sVar29;
    auVar67._4_2_ = auVar27._4_2_ - sVar26;
    auVar67._6_2_ = auVar27._6_2_ - sVar29;
    auVar67._8_2_ = auVar27._8_2_ - sVar26;
    auVar67._10_2_ = auVar27._10_2_ - sVar29;
    auVar67._12_2_ = auVar27._12_2_ - sVar26;
    auVar67._14_2_ = auVar27._14_2_ - sVar29;
    auVar61._0_2_ = auVar24._0_2_ - sVar26;
    auVar61._2_2_ = uVar39 - sVar29;
    auVar61._4_2_ = uVar40 - sVar26;
    auVar61._6_2_ = uVar41 - sVar29;
    auVar61._8_2_ = uVar42 - sVar26;
    auVar61._10_2_ = uVar43 - sVar29;
    auVar61._12_2_ = uVar44 - sVar26;
    auVar61._14_2_ = uVar45 - sVar29;
    auVar38 = pabsw(auVar61,auVar61);
    auVar63 = pabsw(auVar72,auVar67);
    auVar68._0_2_ = (auVar67._0_2_ + auVar24._0_2_) - sVar26;
    auVar68._2_2_ = (auVar67._2_2_ + uVar39) - sVar29;
    auVar68._4_2_ = (auVar67._4_2_ + uVar40) - sVar26;
    auVar68._6_2_ = (auVar67._6_2_ + uVar41) - sVar29;
    auVar68._8_2_ = (auVar67._8_2_ + uVar42) - sVar26;
    auVar68._10_2_ = (auVar67._10_2_ + uVar43) - sVar29;
    auVar68._12_2_ = (auVar67._12_2_ + uVar44) - sVar26;
    auVar68._14_2_ = (auVar67._14_2_ + uVar45) - sVar29;
    auVar46 = pabsw(auVar68,auVar68);
    auVar82._0_2_ = -(ushort)(auVar63._0_2_ < auVar38._0_2_);
    auVar82._2_2_ = -(ushort)(auVar63._2_2_ < auVar38._2_2_);
    auVar82._4_2_ = -(ushort)(auVar63._4_2_ < auVar38._4_2_);
    auVar82._6_2_ = -(ushort)(auVar63._6_2_ < auVar38._6_2_);
    auVar82._8_2_ = -(ushort)(auVar63._8_2_ < auVar38._8_2_);
    auVar82._10_2_ = -(ushort)(auVar63._10_2_ < auVar38._10_2_);
    auVar82._12_2_ = -(ushort)(auVar63._12_2_ < auVar38._12_2_);
    auVar82._14_2_ = -(ushort)(auVar63._14_2_ < auVar38._14_2_);
    auVar62._0_2_ = -(ushort)(auVar46._0_2_ < auVar38._0_2_);
    auVar62._2_2_ = -(ushort)(auVar46._2_2_ < auVar38._2_2_);
    auVar62._4_2_ = -(ushort)(auVar46._4_2_ < auVar38._4_2_);
    auVar62._6_2_ = -(ushort)(auVar46._6_2_ < auVar38._6_2_);
    auVar62._8_2_ = -(ushort)(auVar46._8_2_ < auVar38._8_2_);
    auVar62._10_2_ = -(ushort)(auVar46._10_2_ < auVar38._10_2_);
    auVar62._12_2_ = -(ushort)(auVar46._12_2_ < auVar38._12_2_);
    auVar62._14_2_ = -(ushort)(auVar46._14_2_ < auVar38._14_2_);
    auVar73._0_2_ = -(ushort)(auVar46._0_2_ < auVar63._0_2_);
    auVar73._2_2_ = -(ushort)(auVar46._2_2_ < auVar63._2_2_);
    auVar73._4_2_ = -(ushort)(auVar46._4_2_ < auVar63._4_2_);
    auVar73._6_2_ = -(ushort)(auVar46._6_2_ < auVar63._6_2_);
    auVar73._8_2_ = -(ushort)(auVar46._8_2_ < auVar63._8_2_);
    auVar73._10_2_ = -(ushort)(auVar46._10_2_ < auVar63._10_2_);
    auVar73._12_2_ = -(ushort)(auVar46._12_2_ < auVar63._12_2_);
    auVar73._14_2_ = -(ushort)(auVar46._14_2_ < auVar63._14_2_);
    auVar38 = ~(auVar48 | auVar66) & auVar27 |
              (~auVar51 & auVar25 | auVar28 & auVar51) & (auVar48 | auVar66);
    auVar72 = (~auVar73 & auVar24 | auVar28 & auVar73) & (auVar62 | auVar82);
    auVar59 = ~(auVar62 | auVar82) & auVar27 | auVar72;
    sVar49 = auVar38._0_2_;
    sVar52 = auVar38._2_2_;
    sVar53 = auVar38._4_2_;
    sVar54 = auVar38._6_2_;
    sVar55 = auVar38._8_2_;
    sVar56 = auVar38._10_2_;
    sVar57 = auVar38._12_2_;
    sVar58 = auVar38._14_2_;
    sVar2 = auVar59._0_2_;
    sVar3 = auVar59._2_2_;
    sVar4 = auVar59._4_2_;
    sVar5 = auVar59._6_2_;
    sVar6 = auVar59._8_2_;
    sVar7 = auVar59._10_2_;
    sVar8 = auVar59._12_2_;
    sVar9 = auVar59._14_2_;
    *dst = (0 < sVar49) * (sVar49 < 0x100) * auVar38[0] - (0xff < sVar49);
    dst[1] = (0 < sVar52) * (sVar52 < 0x100) * auVar38[2] - (0xff < sVar52);
    dst[2] = (0 < sVar53) * (sVar53 < 0x100) * auVar38[4] - (0xff < sVar53);
    dst[3] = (0 < sVar54) * (sVar54 < 0x100) * auVar38[6] - (0xff < sVar54);
    dst[4] = (0 < sVar55) * (sVar55 < 0x100) * auVar38[8] - (0xff < sVar55);
    dst[5] = (0 < sVar56) * (sVar56 < 0x100) * auVar38[10] - (0xff < sVar56);
    dst[6] = (0 < sVar57) * (sVar57 < 0x100) * auVar38[0xc] - (0xff < sVar57);
    dst[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar38[0xe] - (0xff < sVar58);
    dst[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar59[0] - (0xff < sVar2);
    dst[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar59[2] - (0xff < sVar3);
    dst[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar59[4] - (0xff < sVar4);
    dst[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar59[6] - (0xff < sVar5);
    dst[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar59[8] - (0xff < sVar6);
    dst[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar59[10] - (0xff < sVar7);
    dst[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar59[0xc] - (0xff < sVar8);
    dst[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar59[0xe] - (0xff < sVar9);
    dst = dst + stride;
    auVar27._0_2_ = auVar37._0_2_ + 1;
    auVar27._2_2_ = auVar37._2_2_ + 1;
    auVar27._4_2_ = auVar37._4_2_ + 1;
    auVar27._6_2_ = auVar37._6_2_ + 1;
    auVar27._8_2_ = auVar37._8_2_ + 1;
    auVar27._10_2_ = auVar37._10_2_ + 1;
    auVar27._12_2_ = auVar37._12_2_ + 1;
    auVar27._14_2_ = auVar37._14_2_ + 1;
    iVar23 = iVar23 + -1;
    auVar37 = auVar27;
  } while (iVar23 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  l = _mm_load_si128((const __m128i *)(left + 16));
  rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}